

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source)

{
  float fVar1;
  int64_t iVar2;
  int64_t iVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  int64_t i;
  size_type local_18;
  
  iVar2 = size((Vector *)0x1d563d);
  iVar3 = size((Vector *)0x1d564c);
  if (iVar2 == iVar3) {
    local_18 = 0;
    while( true ) {
      iVar2 = size((Vector *)0x1d5697);
      if (iVar2 <= (long)local_18) break;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_18);
      fVar1 = *pvVar4;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_18);
      *pvVar5 = fVar1 + *pvVar5;
      local_18 = local_18 + 1;
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                ,0x29,"void fasttext::Vector::addVector(const Vector &)");
}

Assistant:

void Vector::addVector(const Vector& source) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += source.data_[i];
  }
}